

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,cmComputeLinkInformation *pcli,
          cmLinkLineComputer *linkLineComputer,string *linkLibraries,string *frameworkPath,
          string *linkPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  char *pcVar4;
  char *__s;
  string stdLibString;
  string standardLibsVar;
  string libPathTerminator;
  string linkLanguage;
  string fwSearchFlagVar;
  string fwSearchFlag;
  string libPathFlag;
  undefined1 *local_140;
  char *local_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  string local_120;
  string local_100;
  string local_e0;
  long *local_c0 [2];
  long local_b0 [2];
  string local_a0;
  string *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  local_c0[0] = local_b0;
  pcVar2 = (pcli->LinkLanguage)._M_dataplus._M_p;
  local_80 = linkLibraries;
  local_78 = linkPath;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,pcVar2,pcVar2 + (pcli->LinkLanguage)._M_string_length);
  pcVar3 = this->Makefile;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"CMAKE_LIBRARY_PATH_FLAG","")
  ;
  pcVar4 = cmMakefile::GetRequiredDefinition(pcVar3,&local_100);
  std::__cxx11::string::string((string *)&local_50,pcVar4,(allocator *)&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = this->Makefile;
  paVar1 = &local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,"CMAKE_LIBRARY_PATH_TERMINATOR","");
  pcVar4 = cmMakefile::GetSafeDefinition(pcVar3,&local_120);
  std::__cxx11::string::string((string *)&local_100,pcVar4,(allocator *)&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"CMAKE_","");
  pcVar2 = (pcli->LinkLanguage)._M_dataplus._M_p;
  local_140 = &local_130;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,pcVar2,pcVar2 + (pcli->LinkLanguage)._M_string_length);
  std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_140);
  if (local_140 != &local_130) {
    operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
  }
  std::__cxx11::string::append((char *)&local_120);
  local_138 = (char *)0x0;
  local_130 = 0;
  local_140 = &local_130;
  __s = cmMakefile::GetDefinition(this->Makefile,&local_120);
  pcVar4 = local_138;
  if (__s != (char *)0x0) {
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_140,0,pcVar4,(ulong)__s);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"CMAKE_","");
  std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0[0]);
  std::__cxx11::string::append((char *)&local_a0);
  pcVar4 = cmMakefile::GetSafeDefinition(this->Makefile,&local_a0);
  std::__cxx11::string::string((string *)&local_70,pcVar4,(allocator *)&local_e0);
  cmLinkLineComputer::ComputeFrameworkPath(&local_e0,linkLineComputer,pcli,&local_70);
  std::__cxx11::string::operator=((string *)frameworkPath,(string *)&local_e0);
  paVar1 = &local_e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  cmLinkLineComputer::ComputeLinkPath(&local_e0,linkLineComputer,pcli,&local_50,&local_100);
  std::__cxx11::string::operator=((string *)local_78,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  (*linkLineComputer->_vptr_cmLinkLineComputer[3])(&local_e0,linkLineComputer,pcli,&local_140);
  std::__cxx11::string::operator=((string *)local_80,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(
  cmComputeLinkInformation* pcli, cmLinkLineComputer* linkLineComputer,
  std::string& linkLibraries, std::string& frameworkPath,
  std::string& linkPath)
{
  cmComputeLinkInformation& cli = *pcli;

  std::string linkLanguage = cli.GetLinkLanguage();

  std::string libPathFlag =
    this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  std::string libPathTerminator =
    this->Makefile->GetSafeDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");

  // Add standard libraries for this language.
  std::string standardLibsVar = "CMAKE_";
  standardLibsVar += cli.GetLinkLanguage();
  standardLibsVar += "_STANDARD_LIBRARIES";
  std::string stdLibString;
  if (const char* stdLibs = this->Makefile->GetDefinition(standardLibsVar)) {
    stdLibString = stdLibs;
  }

  // Append the framework search path flags.
  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += linkLanguage;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  std::string fwSearchFlag =
    this->Makefile->GetSafeDefinition(fwSearchFlagVar);

  frameworkPath = linkLineComputer->ComputeFrameworkPath(cli, fwSearchFlag);
  linkPath =
    linkLineComputer->ComputeLinkPath(cli, libPathFlag, libPathTerminator);

  linkLibraries = linkLineComputer->ComputeLinkLibraries(cli, stdLibString);
}